

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFx.c
# Opt level: O2

void Div_CubePrintOne(Vec_Int_t *vCube,Vec_Str_t *vStr,int nVars)

{
  int iVar1;
  int i;
  int i_00;
  
  Vec_StrFill(vStr,nVars,(char)nVars);
  for (i_00 = 0; i_00 < vCube->nSize; i_00 = i_00 + 1) {
    iVar1 = Vec_IntEntry(vCube,i_00);
    i = Abc_Lit2Var(iVar1);
    iVar1 = Abc_LitIsCompl(iVar1);
    Vec_StrWriteEntry(vStr,i,(iVar1 == 0) + '0');
  }
  puts(vStr->pArray);
  return;
}

Assistant:

void Div_CubePrintOne( Vec_Int_t * vCube, Vec_Str_t * vStr, int nVars )
{
    int i, Lit;
    Vec_StrFill( vStr, nVars, '-' );
    Vec_IntForEachEntry( vCube, Lit, i )
        Vec_StrWriteEntry( vStr, Abc_Lit2Var(Lit), (char)(Abc_LitIsCompl(Lit) ? '0' : '1') );
    printf( "%s\n", Vec_StrArray(vStr) );
}